

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::BasicWriter<char>::write_int<bool,fmt::FormatSpec>
          (BasicWriter<char> *this,bool value,FormatSpec spec)

{
  undefined4 uVar1;
  uint in_EAX;
  lconv *plVar2;
  CharPtr pcVar3;
  undefined1 uVar4;
  char *pcVar5;
  uint prefix_size;
  long lVar6;
  char prefix [4];
  undefined8 uStack_38;
  
  uVar1 = spec._20_4_;
  uStack_38 = (ulong)in_EAX;
  lVar6 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    uVar4 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      uVar4 = 0x20;
    }
    uStack_38 = (ulong)CONCAT14(uVar4,in_EAX);
    lVar6 = 1;
  }
  prefix_size = (uint)lVar6;
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_00137068;
      if (spec.type_ != 'B') goto code_r0x0013709b;
    }
    else {
      if (spec.type_ == 'X') {
LAB_00136fe6:
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          *(undefined1 *)((long)&uStack_38 + lVar6 + 4) = 0x30;
          prefix_size = prefix_size | 2;
          *(char *)((long)&uStack_38 + lVar6 + 5) = spec.type_;
        }
        pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                           (this,1,&spec,(char *)((long)&uStack_38 + 4),prefix_size);
        pcVar5 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar5 = "0123456789abcdef";
        }
        *pcVar3 = pcVar5[value];
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0013709b;
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      *(undefined1 *)((long)&uStack_38 + lVar6 + 4) = 0x30;
      prefix_size = prefix_size | 2;
      *(char *)((long)&uStack_38 + lVar6 + 5) = spec.type_;
    }
  }
  else if ((byte)spec.type_ < 0x6f) {
    if (spec.type_ != 'd') {
      if (spec.type_ != 'n') goto code_r0x0013709b;
      plVar2 = localeconv();
      strlen(plVar2->thousands_sep);
      uVar1 = spec._20_4_;
    }
  }
  else {
    if (spec.type_ != 'o') {
      if (spec.type_ == 'x') goto LAB_00136fe6;
code_r0x0013709b:
      internal::report_unknown_type(spec.super_AlignSpec.super_WidthSpec.fill_._3_1_,spec._8_8_);
    }
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      prefix_size = prefix_size + 1;
      *(undefined1 *)((long)&uStack_38 + lVar6 + 4) = 0x30;
    }
  }
LAB_00137068:
  spec._20_4_ = uVar1;
  pcVar3 = prepare_int_buffer<fmt::FormatSpec>
                     (this,1,&spec,(char *)((long)&uStack_38 + 4),prefix_size);
  *pcVar3 = value + '0';
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}